

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::Picker::_q_rowsInserted(Picker *this,QModelIndex *parent,int start,int end)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  QModelIndex local_60;
  QModelIndex local_48;
  
  pPVar1 = (this->d).d;
  if ((((pPVar1->inserting == false) &&
       (QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pPVar1->root),
       local_60.r == parent->r)) && (local_60.i == parent->i)) &&
     ((local_60.c == parent->c && (local_60.m == parent->m)))) {
    if (start == 0) {
      pPVar1 = (this->d).d;
      pQVar2 = pPVar1->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pPVar1->root);
      iVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_60);
      if ((end + 1 == iVar5) && (cVar3 = QPersistentModelIndex::isValid(), cVar3 == '\0')) {
        pPVar1 = (this->d).d;
        pQVar2 = pPVar1->model;
        iVar5 = pPVar1->modelColumn;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar1->root);
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_60,pQVar2,0,iVar5,&local_48);
        QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_60);
        setCurrentIndex(this,0);
        return;
      }
    }
    iVar5 = QPersistentModelIndex::row();
    pPVar1 = (this->d).d;
    if (iVar5 == pPVar1->indexBeforeChange) {
      bVar4 = PickerPrivate::isRowsVisible(pPVar1,start,end);
      if (bVar4) {
        QWidget::update();
      }
    }
    else {
      QWidget::update();
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&((this->d).d)->currentIndex);
      _q_emitCurrentIndexChanged(this,&local_60);
    }
  }
  return;
}

Assistant:

void
Picker::_q_rowsInserted( const QModelIndex & parent, int start, int end )
{
	if( d->inserting || parent != d->root )
		return;

	// set current index if picker was previously empty
	if( start == 0 && ( end - start + 1 ) == count() &&
		!d->currentIndex.isValid() )
	{
		d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
		setCurrentIndex( 0 );
	}
	// need to emit changed if model updated index "silently"
	else if( d->currentIndex.row() != d->indexBeforeChange )
	{
		update();
		_q_emitCurrentIndexChanged( d->currentIndex );
	}
	else if( d->isRowsVisible( start, end ) )
		update();
}